

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

void stb_wrapper_dump(char *filename)

{
  ulong uVar1;
  FILE *__stream;
  long lVar2;
  long lVar3;
  
  __stream = fopen(filename,"w");
  if ((__stream != (FILE *)0x0) && (0 < stb__alloc_size)) {
    lVar3 = 0x14;
    lVar2 = 0;
    do {
      uVar1 = *(ulong *)((long)stb__allocations + lVar3 + -0x14);
      if (1 < uVar1) {
        fprintf(__stream,"%p %7d - %4d %s\n",uVar1,
                (ulong)*(uint *)((long)&stb__allocations->p + lVar3),
                (ulong)*(uint *)((long)stb__allocations + lVar3 + -4),
                *(undefined8 *)((long)stb__allocations + lVar3 + -0xc));
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < stb__alloc_size);
  }
  return;
}

Assistant:

void stb_wrapper_dump(char *filename)
{
   int i;
   FILE *f = fopen(filename, "w");
   if (!f) return;
   for (i=0; i < stb__alloc_size; ++i)
      if (stb__allocations[i].p > STB_DEL)
         fprintf(f, "%p %7d - %4d %s\n",
            stb__allocations[i].p   , stb__allocations[i].size,
            stb__allocations[i].line, stb__allocations[i].file);
}